

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Receptacle.cpp
# Opt level: O3

bool __thiscall
Refal2::CReceptacle::find
          (CReceptacle *this,CUnitNode *key,CUnitNode **leftBorderNode,CUnitNode **equalNode)

{
  CNode<Refal2::CUnit> **ppCVar1;
  TUnitType TVar2;
  CUnitNode *pCVar3;
  bool bVar4;
  int iVar5;
  CNode<Refal2::CUnit> *unit;
  CNode<Refal2::CUnit> *this_00;
  
  pCVar3 = (this->data).super_CNodeList<Refal2::CUnit>.first;
  *leftBorderNode = pCVar3;
  do {
    if (pCVar3 == (CUnitNode *)0x0) {
      bVar4 = false;
      unit = (CUnitNode *)0x0;
LAB_0012fd67:
      *equalNode = unit;
      return bVar4;
    }
    if (((pCVar3->super_CUnit).type & UT_LeftParen) == 0) {
      __assert_fail("leftBorderNode->IsLeftParen()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Receptacle.cpp"
                    ,0x76,
                    "bool Refal2::CReceptacle::find(const CUnitNode *, CUnitNode *&, CUnitNode *&)")
      ;
    }
    unit = pCVar3->next;
    iVar5 = 0;
    this_00 = key;
    if (key != (CUnitNode *)0x0) {
      do {
        bVar4 = CUnit::IsEqualWith(&this_00->super_CUnit,&unit->super_CUnit);
        if (!bVar4) {
          if (((this_00->super_CUnit).type & UT_Char) == 0) goto LAB_0012fd4b;
LAB_0012fd35:
          if ((this_00->super_CUnit).field_1.c != '=') goto LAB_0012fd4b;
          break;
        }
        TVar2 = (this_00->super_CUnit).type;
        if (((iVar5 < 1) && ((TVar2 & UT_Char) != 0)) && ((this_00->super_CUnit).field_1.c == '='))
        goto LAB_0012fd35;
        if ((TVar2 & UT_LeftParen) == 0) {
          if ((TVar2 & UT_RightParen) != 0) {
            if (iVar5 < 1) {
              __assert_fail("depth > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Receptacle.cpp"
                            ,0x80,
                            "bool Refal2::CReceptacle::find(const CUnitNode *, CUnitNode *&, CUnitNode *&)"
                           );
            }
            iVar5 = iVar5 + -1;
          }
        }
        else {
          iVar5 = iVar5 + 1;
        }
        ppCVar1 = &this_00->next;
        unit = unit->next;
        this_00 = *ppCVar1;
      } while (*ppCVar1 != (CNode<Refal2::CUnit> *)0x0);
    }
    if ((((unit->super_CUnit).type & UT_Char) != 0) && ((unit->super_CUnit).field_1.c == '=')) {
      bVar4 = true;
      if (iVar5 != 0) {
        __assert_fail("depth == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Receptacle.cpp"
                      ,0x89,
                      "bool Refal2::CReceptacle::find(const CUnitNode *, CUnitNode *&, CUnitNode *&)"
                     );
      }
      goto LAB_0012fd67;
    }
LAB_0012fd4b:
    pCVar3 = (((*leftBorderNode)->super_CUnit).field_1.pairedParen)->next;
    *leftBorderNode = pCVar3;
  } while( true );
}

Assistant:

bool CReceptacle::find( const CUnitNode* key,
	CUnitNode*& leftBorderNode, CUnitNode*& equalNode )
{
	leftBorderNode = data.GetFirst();
	while( leftBorderNode != nullptr ) {
		assert( leftBorderNode->IsLeftParen() );
		const CUnitNode* keyNode = key;
		CUnitNode* burriedKeyNode = leftBorderNode->Next();
		int depth = 0;
		while( keyNode != nullptr && keyNode->IsEqualWith( *burriedKeyNode )
			&& ( depth > 0 || !isEqualNode( keyNode ) ) )
		{
			if( keyNode->IsLeftParen() ) {
				depth++;
			} else if( keyNode->IsRightParen() ) {
				assert( depth > 0 );
				depth--;
			}
			keyNode = keyNode->Next();
			burriedKeyNode = burriedKeyNode->Next();
		}
		if( ( keyNode == nullptr || isEqualNode( keyNode ) )
			&& isEqualNode( burriedKeyNode ) )
		{
			assert( depth == 0 );
			equalNode = burriedKeyNode;
			return true;
		}
		leftBorderNode = leftBorderNode->PairedParen()->Next();
	}
	equalNode = nullptr;
	return false;
}